

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
StrEqualNode::Evaluate
          (string *__return_storage_ptr__,StrEqualNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var1;
  char *pcVar2;
  allocator local_9;
  
  __lhs = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  _Var1 = std::operator==(__lhs,__lhs + 1);
  pcVar2 = "0";
  if (_Var1) {
    pcVar2 = "1";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* /*context*/,
                       const GeneratorExpressionContent* /*content*/,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    return *parameters.begin() == parameters[1] ? "1" : "0";
  }